

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  byte bVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined4 uVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  Scene *pSVar17;
  undefined1 (*pauVar18) [16];
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar68 [64];
  undefined1 auVar72 [16];
  uint uVar74;
  uint uVar75;
  uint uVar76;
  undefined1 auVar73 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2700 [16];
  Scene *local_26e8;
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [16];
  undefined1 (*local_2690) [16];
  ulong local_2688;
  ulong local_2680;
  long local_2678;
  ulong local_2670;
  long local_2668;
  RTCFilterFunctionNArguments local_2660;
  undefined8 local_2630;
  undefined8 uStack_2628;
  undefined1 local_2620 [32];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25d0 [16];
  float local_25c0 [4];
  float local_25b0 [4];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [2] [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined8 local_2520;
  undefined8 uStack_2518;
  RTCHitN local_2510 [16];
  undefined4 local_2500;
  undefined4 uStack_24fc;
  undefined4 uStack_24f8;
  undefined4 uStack_24f4;
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined4 local_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  undefined4 local_24c0;
  undefined4 uStack_24bc;
  undefined4 uStack_24b8;
  undefined4 uStack_24b4;
  uint local_24b0;
  uint uStack_24ac;
  uint uStack_24a8;
  uint uStack_24a4;
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar13;
  
  pauVar18 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar57 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_23c0._4_4_ = fVar57;
  local_23c0._0_4_ = fVar57;
  local_23c0._8_4_ = fVar57;
  local_23c0._12_4_ = fVar57;
  local_23c0._16_4_ = fVar57;
  local_23c0._20_4_ = fVar57;
  local_23c0._24_4_ = fVar57;
  local_23c0._28_4_ = fVar57;
  auVar63 = ZEXT3264(local_23c0);
  fVar64 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = fVar64;
  local_23e0._0_4_ = fVar64;
  local_23e0._8_4_ = fVar64;
  local_23e0._12_4_ = fVar64;
  local_23e0._16_4_ = fVar64;
  local_23e0._20_4_ = fVar64;
  local_23e0._24_4_ = fVar64;
  local_23e0._28_4_ = fVar64;
  auVar68 = ZEXT3264(local_23e0);
  fVar69 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = fVar69;
  local_2400._0_4_ = fVar69;
  local_2400._8_4_ = fVar69;
  local_2400._12_4_ = fVar69;
  local_2400._16_4_ = fVar69;
  local_2400._20_4_ = fVar69;
  local_2400._24_4_ = fVar69;
  local_2400._28_4_ = fVar69;
  auVar73 = ZEXT3264(local_2400);
  fVar57 = fVar57 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar64 = fVar64 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar69 = fVar69 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar29 = uVar23 ^ 0x20;
  uVar30 = uVar25 ^ 0x20;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar40 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_2420._0_8_ = CONCAT44(fVar57,fVar57) ^ 0x8000000080000000;
  local_2420._8_4_ = -fVar57;
  local_2420._12_4_ = -fVar57;
  local_2420._16_4_ = -fVar57;
  local_2420._20_4_ = -fVar57;
  local_2420._24_4_ = -fVar57;
  local_2420._28_4_ = -fVar57;
  auVar79 = ZEXT3264(local_2420);
  local_2440._0_8_ = CONCAT44(fVar64,fVar64) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar64;
  local_2440._12_4_ = -fVar64;
  local_2440._16_4_ = -fVar64;
  local_2440._20_4_ = -fVar64;
  local_2440._24_4_ = -fVar64;
  local_2440._28_4_ = -fVar64;
  auVar81 = ZEXT3264(local_2440);
  local_2460._0_8_ = CONCAT44(fVar69,fVar69) ^ 0x8000000080000000;
  local_2460._8_4_ = -fVar69;
  local_2460._12_4_ = -fVar69;
  local_2460._16_4_ = -fVar69;
  local_2460._20_4_ = -fVar69;
  local_2460._24_4_ = -fVar69;
  local_2460._28_4_ = -fVar69;
  auVar84 = ZEXT3264(local_2460);
  iVar2 = (tray->tnear).field_0.i[k];
  local_2480._4_4_ = iVar2;
  local_2480._0_4_ = iVar2;
  local_2480._8_4_ = iVar2;
  local_2480._12_4_ = iVar2;
  local_2480._16_4_ = iVar2;
  local_2480._20_4_ = iVar2;
  local_2480._24_4_ = iVar2;
  local_2480._28_4_ = iVar2;
  auVar86 = ZEXT3264(local_2480);
  local_2690 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_2688 = uVar25;
  local_2680 = uVar23;
LAB_01662bea:
  do {
    do {
      if (pauVar18 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar15 = pauVar18 + -1;
      pauVar18 = pauVar18 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar15 + 8));
    uVar16 = *(ulong *)*pauVar18;
    while ((uVar16 & 8) == 0) {
      uVar10 = uVar16 & 0xfffffffffffffff0;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar48._4_4_ = uVar9;
      auVar48._0_4_ = uVar9;
      auVar48._8_4_ = uVar9;
      auVar48._12_4_ = uVar9;
      auVar48._16_4_ = uVar9;
      auVar48._20_4_ = uVar9;
      auVar48._24_4_ = uVar9;
      auVar48._28_4_ = uVar9;
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar23),auVar48,
                                *(undefined1 (*) [32])(uVar10 + 0x40 + uVar23));
      auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar63._0_32_,auVar79._0_32_);
      auVar49 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar25),auVar48,
                                *(undefined1 (*) [32])(uVar10 + 0x40 + uVar25));
      auVar49 = vfmadd213ps_fma(ZEXT1632(auVar49),auVar68._0_32_,auVar81._0_32_);
      auVar7 = vpmaxsd_avx2(ZEXT1632(auVar41),ZEXT1632(auVar49));
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar20),auVar48,
                                *(undefined1 (*) [32])(uVar10 + 0x40 + uVar20));
      auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar73._0_32_,auVar84._0_32_);
      auVar8 = vpmaxsd_avx2(ZEXT1632(auVar41),auVar86._0_32_);
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar29),auVar48,
                                *(undefined1 (*) [32])(uVar10 + 0x40 + uVar29));
      local_2620 = vpmaxsd_avx2(auVar7,auVar8);
      auVar49 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar30),auVar48,
                                *(undefined1 (*) [32])(uVar10 + 0x40 + uVar30));
      auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar63._0_32_,auVar79._0_32_);
      auVar49 = vfmadd213ps_fma(ZEXT1632(auVar49),auVar68._0_32_,auVar81._0_32_);
      auVar7 = vpminsd_avx2(ZEXT1632(auVar41),ZEXT1632(auVar49));
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar20 ^ 0x20)),auVar48,
                                *(undefined1 (*) [32])(uVar10 + 0x40 + (uVar20 ^ 0x20)));
      auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar73._0_32_,auVar84._0_32_);
      auVar8 = vpminsd_avx2(ZEXT1632(auVar41),auVar40._0_32_);
      auVar7 = vpminsd_avx2(auVar7,auVar8);
      auVar7 = vcmpps_avx(local_2620,auVar7,2);
      if (((uint)uVar16 & 7) == 6) {
        auVar8 = vcmpps_avx(*(undefined1 (*) [32])(uVar10 + 0x1c0),auVar48,2);
        auVar48 = vcmpps_avx(auVar48,*(undefined1 (*) [32])(uVar10 + 0x1e0),1);
        auVar8 = vandps_avx(auVar8,auVar48);
        auVar7 = vandps_avx(auVar8,auVar7);
        auVar41 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
      }
      else {
        auVar41 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
      }
      auVar41 = vpsllw_avx(auVar41,0xf);
      if ((((((((auVar41 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar41 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar41 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar41 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar41[0xf])
      goto LAB_01662bea;
      auVar41 = vpacksswb_avx(auVar41,auVar41);
      bVar6 = SUB161(auVar41 >> 7,0) & 1 | (SUB161(auVar41 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar41 >> 0x17,0) & 1) << 2 | (SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar41 >> 0x27,0) & 1) << 4 | (SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar41 >> 0x37,0) & 1) << 6 | SUB161(auVar41 >> 0x3f,0) << 7;
      lVar11 = 0;
      for (uVar16 = (ulong)bVar6; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
        lVar11 = lVar11 + 1;
      }
      uVar16 = *(ulong *)(uVar10 + lVar11 * 8);
      uVar12 = bVar6 - 1 & (uint)bVar6;
      uVar13 = (ulong)uVar12;
      if (uVar12 != 0) {
        uVar74 = *(uint *)(local_2620 + lVar11 * 4);
        lVar11 = 0;
        for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
          lVar11 = lVar11 + 1;
        }
        uVar12 = uVar12 - 1 & uVar12;
        uVar14 = (ulong)uVar12;
        uVar13 = *(ulong *)(uVar10 + lVar11 * 8);
        uVar75 = *(uint *)(local_2620 + lVar11 * 4);
        if (uVar12 == 0) {
          if (uVar74 < uVar75) {
            *(ulong *)*pauVar18 = uVar13;
            *(uint *)(*pauVar18 + 8) = uVar75;
            pauVar18 = pauVar18 + 1;
          }
          else {
            *(ulong *)*pauVar18 = uVar16;
            *(uint *)(*pauVar18 + 8) = uVar74;
            pauVar18 = pauVar18 + 1;
            uVar16 = uVar13;
          }
        }
        else {
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar16;
          auVar41 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar74));
          auVar49._8_8_ = 0;
          auVar49._0_8_ = uVar13;
          auVar49 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar75));
          lVar11 = 0;
          for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            lVar11 = lVar11 + 1;
          }
          uVar12 = uVar12 - 1 & uVar12;
          uVar16 = (ulong)uVar12;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *(ulong *)(uVar10 + lVar11 * 8);
          auVar42 = vpunpcklqdq_avx(auVar53,ZEXT416(*(uint *)(local_2620 + lVar11 * 4)));
          auVar53 = vpcmpgtd_avx(auVar49,auVar41);
          if (uVar12 == 0) {
            auVar58 = vpshufd_avx(auVar53,0xaa);
            auVar53 = vblendvps_avx(auVar49,auVar41,auVar58);
            auVar41 = vblendvps_avx(auVar41,auVar49,auVar58);
            auVar49 = vpcmpgtd_avx(auVar42,auVar53);
            auVar58 = vpshufd_avx(auVar49,0xaa);
            auVar49 = vblendvps_avx(auVar42,auVar53,auVar58);
            auVar53 = vblendvps_avx(auVar53,auVar42,auVar58);
            auVar42 = vpcmpgtd_avx(auVar53,auVar41);
            auVar58 = vpshufd_avx(auVar42,0xaa);
            auVar42 = vblendvps_avx(auVar53,auVar41,auVar58);
            auVar41 = vblendvps_avx(auVar41,auVar53,auVar58);
            *pauVar18 = auVar41;
            pauVar18[1] = auVar42;
            uVar16 = auVar49._0_8_;
            pauVar18 = pauVar18 + 2;
          }
          else {
            lVar11 = 0;
            for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
              lVar11 = lVar11 + 1;
            }
            uVar12 = uVar12 - 1 & uVar12;
            uVar16 = (ulong)uVar12;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = *(ulong *)(uVar10 + lVar11 * 8);
            auVar58 = vpunpcklqdq_avx(auVar58,ZEXT416(*(uint *)(local_2620 + lVar11 * 4)));
            if (uVar12 == 0) {
              auVar35 = vpshufd_avx(auVar53,0xaa);
              auVar53 = vblendvps_avx(auVar49,auVar41,auVar35);
              auVar41 = vblendvps_avx(auVar41,auVar49,auVar35);
              auVar49 = vpcmpgtd_avx(auVar58,auVar42);
              auVar35 = vpshufd_avx(auVar49,0xaa);
              auVar49 = vblendvps_avx(auVar58,auVar42,auVar35);
              auVar42 = vblendvps_avx(auVar42,auVar58,auVar35);
              auVar58 = vpcmpgtd_avx(auVar42,auVar41);
              auVar35 = vpshufd_avx(auVar58,0xaa);
              auVar58 = vblendvps_avx(auVar42,auVar41,auVar35);
              auVar41 = vblendvps_avx(auVar41,auVar42,auVar35);
              auVar42 = vpcmpgtd_avx(auVar49,auVar53);
              auVar35 = vpshufd_avx(auVar42,0xaa);
              auVar42 = vblendvps_avx(auVar49,auVar53,auVar35);
              auVar49 = vblendvps_avx(auVar53,auVar49,auVar35);
              auVar53 = vpcmpgtd_avx(auVar58,auVar49);
              auVar35 = vpshufd_avx(auVar53,0xaa);
              auVar53 = vblendvps_avx(auVar58,auVar49,auVar35);
              auVar49 = vblendvps_avx(auVar49,auVar58,auVar35);
              *pauVar18 = auVar41;
              pauVar18[1] = auVar49;
              pauVar18[2] = auVar53;
              uVar16 = auVar42._0_8_;
              pauVar18 = pauVar18 + 3;
            }
            else {
              *pauVar18 = auVar41;
              pauVar18[1] = auVar49;
              pauVar18[2] = auVar42;
              pauVar15 = pauVar18 + 3;
              pauVar18[3] = auVar58;
              do {
                lVar11 = 0;
                for (uVar13 = uVar16; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
                {
                  lVar11 = lVar11 + 1;
                }
                auVar42._8_8_ = 0;
                auVar42._0_8_ = *(ulong *)(uVar10 + lVar11 * 8);
                auVar41 = vpunpcklqdq_avx(auVar42,ZEXT416(*(uint *)(local_2620 + lVar11 * 4)));
                pauVar15[1] = auVar41;
                pauVar15 = pauVar15 + 1;
                uVar16 = uVar16 - 1 & uVar16;
              } while (uVar16 != 0);
              lVar11 = 0;
              while (pauVar15 != pauVar18) {
                auVar41 = pauVar18[1];
                uVar12 = vextractps_avx(auVar41,2);
                for (lVar19 = 0x10;
                    (lVar11 != lVar19 && (*(uint *)(pauVar18[-1] + lVar19 + 8) < uVar12));
                    lVar19 = lVar19 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar18 + lVar19) =
                       *(undefined1 (*) [16])(pauVar18[-1] + lVar19);
                }
                *(undefined1 (*) [16])(*pauVar18 + lVar19) = auVar41;
                lVar11 = lVar11 + -0x10;
                pauVar18 = pauVar18 + 1;
              }
              uVar16 = *(ulong *)*pauVar15;
              pauVar18 = pauVar15;
            }
          }
        }
      }
    }
    local_2678 = (ulong)((uint)uVar16 & 0xf) - 8;
    uVar16 = uVar16 & 0xfffffffffffffff0;
    for (local_2668 = 0; local_2668 != local_2678; local_2668 = local_2668 + 1) {
      lVar24 = local_2668 * 0x50;
      pSVar17 = context->scene;
      pGVar4 = (pSVar17->geometries).items[*(uint *)(uVar16 + 0x30 + lVar24)].ptr;
      fVar57 = (pGVar4->time_range).lower;
      fVar57 = pGVar4->fnumTimeSegments *
               ((*(float *)(ray + k * 4 + 0x70) - fVar57) / ((pGVar4->time_range).upper - fVar57));
      auVar41 = vroundss_avx(ZEXT416((uint)fVar57),ZEXT416((uint)fVar57),9);
      auVar41 = vminss_avx(auVar41,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
      auVar43 = vmaxss_avx(ZEXT816(0),auVar41);
      lVar19 = (long)(int)auVar43._0_4_ * 0x38;
      uVar26 = (ulong)*(uint *)(uVar16 + 4 + lVar24);
      lVar11 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar19);
      lVar19 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar19);
      auVar41 = *(undefined1 (*) [16])(lVar11 + (ulong)*(uint *)(uVar16 + lVar24) * 4);
      uVar25 = (ulong)*(uint *)(uVar16 + 0x10 + lVar24);
      auVar49 = *(undefined1 (*) [16])(lVar11 + uVar25 * 4);
      uVar10 = (ulong)*(uint *)(uVar16 + 0x20 + lVar24);
      auVar51 = *(undefined1 (*) [16])(lVar11 + uVar10 * 4);
      auVar53 = *(undefined1 (*) [16])(lVar11 + uVar26 * 4);
      uVar13 = (ulong)*(uint *)(uVar16 + 0x14 + lVar24);
      auVar42 = *(undefined1 (*) [16])(lVar11 + uVar13 * 4);
      uVar14 = (ulong)*(uint *)(uVar16 + 0x24 + lVar24);
      auVar54 = *(undefined1 (*) [16])(lVar11 + uVar14 * 4);
      uVar21 = (ulong)*(uint *)(uVar16 + 8 + lVar24);
      auVar58 = *(undefined1 (*) [16])(lVar11 + uVar21 * 4);
      local_2670 = (ulong)*(uint *)(uVar16 + 0x18 + lVar24);
      auVar35 = *(undefined1 (*) [16])(lVar11 + local_2670 * 4);
      uVar27 = (ulong)*(uint *)(uVar16 + 0x28 + lVar24);
      auVar31 = *(undefined1 (*) [16])(lVar11 + uVar27 * 4);
      uVar22 = (ulong)*(uint *)(uVar16 + 0xc + lVar24);
      auVar37 = *(undefined1 (*) [16])(lVar11 + uVar22 * 4);
      uVar28 = (ulong)*(uint *)(uVar16 + 0x1c + lVar24);
      auVar32 = *(undefined1 (*) [16])(lVar11 + uVar28 * 4);
      uVar23 = (ulong)*(uint *)(uVar16 + 0x2c + lVar24);
      auVar33 = *(undefined1 (*) [16])(lVar11 + uVar23 * 4);
      auVar34 = *(undefined1 (*) [16])(lVar19 + (ulong)*(uint *)(uVar16 + lVar24) * 4);
      auVar44 = *(undefined1 (*) [16])(lVar19 + uVar25 * 4);
      fVar57 = fVar57 - auVar43._0_4_;
      auVar43 = vunpcklps_avx(auVar41,auVar58);
      auVar58 = vunpckhps_avx(auVar41,auVar58);
      auVar50 = vunpcklps_avx(auVar53,auVar37);
      auVar53 = vunpckhps_avx(auVar53,auVar37);
      auVar41 = *(undefined1 (*) [16])(lVar19 + uVar26 * 4);
      local_2540 = vunpcklps_avx(auVar58,auVar53);
      auVar37 = vunpcklps_avx(auVar43,auVar50);
      auVar58 = vunpckhps_avx(auVar43,auVar50);
      auVar43 = vunpcklps_avx(auVar49,auVar35);
      auVar53 = vunpckhps_avx(auVar49,auVar35);
      auVar35 = vunpcklps_avx(auVar42,auVar32);
      auVar42 = vunpckhps_avx(auVar42,auVar32);
      auVar49 = *(undefined1 (*) [16])(lVar19 + uVar21 * 4);
      local_2530 = vunpcklps_avx(auVar53,auVar42);
      auVar32 = vunpcklps_avx(auVar43,auVar35);
      local_2550 = vunpckhps_avx(auVar43,auVar35);
      auVar43 = vunpcklps_avx(auVar51,auVar31);
      auVar42 = vunpckhps_avx(auVar51,auVar31);
      auVar31 = vunpcklps_avx(auVar54,auVar33);
      auVar35 = vunpckhps_avx(auVar54,auVar33);
      auVar53 = *(undefined1 (*) [16])(lVar19 + uVar22 * 4);
      local_26c0 = vunpcklps_avx(auVar42,auVar35);
      local_26d0 = vunpcklps_avx(auVar43,auVar31);
      local_26e0 = vunpckhps_avx(auVar43,auVar31);
      auVar42 = vunpcklps_avx(auVar34,auVar49);
      auVar49 = vunpckhps_avx(auVar34,auVar49);
      auVar35 = vunpcklps_avx(auVar41,auVar53);
      auVar53 = vunpckhps_avx(auVar41,auVar53);
      auVar41 = *(undefined1 (*) [16])(lVar19 + local_2670 * 4);
      auVar31 = vunpcklps_avx(auVar49,auVar53);
      auVar33 = vunpcklps_avx(auVar42,auVar35);
      auVar53 = vunpckhps_avx(auVar42,auVar35);
      auVar35 = vunpcklps_avx(auVar44,auVar41);
      auVar42 = vunpckhps_avx(auVar44,auVar41);
      auVar41 = *(undefined1 (*) [16])(lVar19 + uVar13 * 4);
      auVar49 = *(undefined1 (*) [16])(lVar19 + uVar28 * 4);
      auVar34 = vunpcklps_avx(auVar41,auVar49);
      auVar41 = vunpckhps_avx(auVar41,auVar49);
      auVar44 = vunpcklps_avx(auVar42,auVar41);
      auVar43 = vunpcklps_avx(auVar35,auVar34);
      auVar42 = vunpckhps_avx(auVar35,auVar34);
      auVar41 = *(undefined1 (*) [16])(lVar19 + uVar10 * 4);
      auVar49 = *(undefined1 (*) [16])(lVar19 + uVar27 * 4);
      auVar34 = vunpcklps_avx(auVar41,auVar49);
      auVar35 = vunpckhps_avx(auVar41,auVar49);
      auVar41 = *(undefined1 (*) [16])(lVar19 + uVar14 * 4);
      auVar49 = *(undefined1 (*) [16])(lVar19 + uVar23 * 4);
      auVar50 = vunpcklps_avx(auVar41,auVar49);
      auVar41 = vunpckhps_avx(auVar41,auVar49);
      auVar49 = vunpcklps_avx(auVar35,auVar41);
      auVar35 = vunpcklps_avx(auVar34,auVar50);
      auVar41 = vunpckhps_avx(auVar34,auVar50);
      fVar64 = 1.0 - fVar57;
      auVar82._4_4_ = fVar64;
      auVar82._0_4_ = fVar64;
      auVar82._8_4_ = fVar64;
      auVar82._12_4_ = fVar64;
      auVar59._0_4_ = fVar57 * auVar33._0_4_;
      auVar59._4_4_ = fVar57 * auVar33._4_4_;
      auVar59._8_4_ = fVar57 * auVar33._8_4_;
      auVar59._12_4_ = fVar57 * auVar33._12_4_;
      auVar37 = vfmadd231ps_fma(auVar59,auVar82,auVar37);
      auVar60._0_4_ = fVar57 * auVar53._0_4_;
      auVar60._4_4_ = fVar57 * auVar53._4_4_;
      auVar60._8_4_ = fVar57 * auVar53._8_4_;
      auVar60._12_4_ = fVar57 * auVar53._12_4_;
      auVar33 = vfmadd231ps_fma(auVar60,auVar82,auVar58);
      auVar65._0_4_ = fVar57 * auVar31._0_4_;
      auVar65._4_4_ = fVar57 * auVar31._4_4_;
      auVar65._8_4_ = fVar57 * auVar31._8_4_;
      auVar65._12_4_ = fVar57 * auVar31._12_4_;
      auVar34 = vfmadd231ps_fma(auVar65,auVar82,local_2540);
      auVar31._0_4_ = fVar57 * auVar43._0_4_;
      auVar31._4_4_ = fVar57 * auVar43._4_4_;
      auVar31._8_4_ = fVar57 * auVar43._8_4_;
      auVar31._12_4_ = fVar57 * auVar43._12_4_;
      auVar53 = vfmadd231ps_fma(auVar31,auVar82,auVar32);
      auVar43._0_4_ = fVar57 * auVar42._0_4_;
      auVar43._4_4_ = fVar57 * auVar42._4_4_;
      auVar43._8_4_ = fVar57 * auVar42._8_4_;
      auVar43._12_4_ = fVar57 * auVar42._12_4_;
      auVar42 = vfmadd231ps_fma(auVar43,auVar82,local_2550);
      auVar50._0_4_ = fVar57 * auVar44._0_4_;
      auVar50._4_4_ = fVar57 * auVar44._4_4_;
      auVar50._8_4_ = fVar57 * auVar44._8_4_;
      auVar50._12_4_ = fVar57 * auVar44._12_4_;
      auVar58 = vfmadd231ps_fma(auVar50,auVar82,local_2530);
      puVar1 = (undefined8 *)(uVar16 + 0x30 + lVar24);
      local_2520 = *puVar1;
      uStack_2518 = puVar1[1];
      puVar1 = (undefined8 *)(uVar16 + 0x40 + lVar24);
      auVar55._0_4_ = fVar57 * auVar35._0_4_;
      auVar55._4_4_ = fVar57 * auVar35._4_4_;
      auVar55._8_4_ = fVar57 * auVar35._8_4_;
      auVar55._12_4_ = fVar57 * auVar35._12_4_;
      auVar77._0_4_ = fVar57 * auVar41._0_4_;
      auVar77._4_4_ = fVar57 * auVar41._4_4_;
      auVar77._8_4_ = fVar57 * auVar41._8_4_;
      auVar77._12_4_ = fVar57 * auVar41._12_4_;
      auVar85._0_4_ = fVar57 * auVar49._0_4_;
      auVar85._4_4_ = fVar57 * auVar49._4_4_;
      auVar85._8_4_ = fVar57 * auVar49._8_4_;
      auVar85._12_4_ = fVar57 * auVar49._12_4_;
      auVar35 = vfmadd231ps_fma(auVar55,auVar82,local_26d0);
      auVar31 = vfmadd231ps_fma(auVar77,auVar82,local_26e0);
      auVar32 = vfmadd231ps_fma(auVar85,auVar82,local_26c0);
      local_2630 = *puVar1;
      uStack_2628 = puVar1[1];
      auVar49 = vsubps_avx(auVar37,auVar53);
      auVar41 = vsubps_avx(auVar33,auVar42);
      auVar53 = vsubps_avx(auVar34,auVar58);
      auVar42 = vsubps_avx(auVar35,auVar37);
      auVar58 = vsubps_avx(auVar31,auVar33);
      auVar35 = vsubps_avx(auVar32,auVar34);
      auVar44._0_4_ = auVar41._0_4_ * auVar35._0_4_;
      auVar44._4_4_ = auVar41._4_4_ * auVar35._4_4_;
      auVar44._8_4_ = auVar41._8_4_ * auVar35._8_4_;
      auVar44._12_4_ = auVar41._12_4_ * auVar35._12_4_;
      local_2590 = vfmsub231ps_fma(auVar44,auVar58,auVar53);
      auVar54._0_4_ = auVar53._0_4_ * auVar42._0_4_;
      auVar54._4_4_ = auVar53._4_4_ * auVar42._4_4_;
      auVar54._8_4_ = auVar53._8_4_ * auVar42._8_4_;
      auVar54._12_4_ = auVar53._12_4_ * auVar42._12_4_;
      local_2580 = vfmsub231ps_fma(auVar54,auVar35,auVar49);
      uVar9 = *(undefined4 *)(ray + k * 4);
      auVar51._4_4_ = uVar9;
      auVar51._0_4_ = uVar9;
      auVar51._8_4_ = uVar9;
      auVar51._12_4_ = uVar9;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar56._4_4_ = uVar9;
      auVar56._0_4_ = uVar9;
      auVar56._8_4_ = uVar9;
      auVar56._12_4_ = uVar9;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar32._4_4_ = uVar9;
      auVar32._0_4_ = uVar9;
      auVar32._8_4_ = uVar9;
      auVar32._12_4_ = uVar9;
      fVar57 = *(float *)(ray + k * 4 + 0x40);
      auVar83._4_4_ = fVar57;
      auVar83._0_4_ = fVar57;
      auVar83._8_4_ = fVar57;
      auVar83._12_4_ = fVar57;
      auVar31 = vsubps_avx(auVar37,auVar51);
      fVar64 = *(float *)(ray + k * 4 + 0x50);
      auVar87._4_4_ = fVar64;
      auVar87._0_4_ = fVar64;
      auVar87._8_4_ = fVar64;
      auVar87._12_4_ = fVar64;
      auVar37 = vsubps_avx(auVar33,auVar56);
      fVar69 = *(float *)(ray + k * 4 + 0x60);
      auVar88._4_4_ = fVar69;
      auVar88._0_4_ = fVar69;
      auVar88._8_4_ = fVar69;
      auVar88._12_4_ = fVar69;
      auVar32 = vsubps_avx(auVar34,auVar32);
      auVar33._0_4_ = fVar57 * auVar37._0_4_;
      auVar33._4_4_ = fVar57 * auVar37._4_4_;
      auVar33._8_4_ = fVar57 * auVar37._8_4_;
      auVar33._12_4_ = fVar57 * auVar37._12_4_;
      auVar33 = vfmsub231ps_fma(auVar33,auVar31,auVar87);
      auVar66._0_4_ = auVar35._0_4_ * auVar33._0_4_;
      auVar66._4_4_ = auVar35._4_4_ * auVar33._4_4_;
      auVar66._8_4_ = auVar35._8_4_ * auVar33._8_4_;
      auVar66._12_4_ = auVar35._12_4_ * auVar33._12_4_;
      auVar34._0_4_ = auVar53._0_4_ * auVar33._0_4_;
      auVar34._4_4_ = auVar53._4_4_ * auVar33._4_4_;
      auVar34._8_4_ = auVar53._8_4_ * auVar33._8_4_;
      auVar34._12_4_ = auVar53._12_4_ * auVar33._12_4_;
      auVar61._0_4_ = fVar69 * auVar31._0_4_;
      auVar61._4_4_ = fVar69 * auVar31._4_4_;
      auVar61._8_4_ = fVar69 * auVar31._8_4_;
      auVar61._12_4_ = fVar69 * auVar31._12_4_;
      auVar35 = vfmsub231ps_fma(auVar61,auVar32,auVar83);
      auVar53 = vfmadd231ps_fma(auVar66,auVar35,auVar58);
      auVar35 = vfmadd231ps_fma(auVar34,auVar41,auVar35);
      auVar62._0_4_ = auVar58._0_4_ * auVar49._0_4_;
      auVar62._4_4_ = auVar58._4_4_ * auVar49._4_4_;
      auVar62._8_4_ = auVar58._8_4_ * auVar49._8_4_;
      auVar62._12_4_ = auVar58._12_4_ * auVar49._12_4_;
      local_2570[0] = vfmsub231ps_fma(auVar62,auVar42,auVar41);
      auVar78._0_4_ = fVar64 * auVar32._0_4_;
      auVar78._4_4_ = fVar64 * auVar32._4_4_;
      auVar78._8_4_ = fVar64 * auVar32._8_4_;
      auVar78._12_4_ = fVar64 * auVar32._12_4_;
      auVar33 = vfmsub231ps_fma(auVar78,auVar37,auVar88);
      auVar80._0_4_ = fVar69 * local_2570[0]._0_4_;
      auVar80._4_4_ = fVar69 * local_2570[0]._4_4_;
      auVar80._8_4_ = fVar69 * local_2570[0]._8_4_;
      auVar80._12_4_ = fVar69 * local_2570[0]._12_4_;
      auVar41 = vfmadd231ps_fma(auVar80,local_2580,auVar87);
      auVar58 = vfmadd231ps_fma(auVar41,local_2590,auVar83);
      auVar72._8_4_ = 0x80000000;
      auVar72._0_8_ = 0x8000000080000000;
      auVar72._12_4_ = 0x80000000;
      auVar53 = vfmadd231ps_fma(auVar53,auVar33,auVar42);
      auVar41 = vandps_avx(auVar58,auVar72);
      uVar12 = auVar41._0_4_;
      local_2620._0_4_ = (float)(uVar12 ^ auVar53._0_4_);
      uVar74 = auVar41._4_4_;
      local_2620._4_4_ = (float)(uVar74 ^ auVar53._4_4_);
      uVar75 = auVar41._8_4_;
      local_2620._8_4_ = (float)(uVar75 ^ auVar53._8_4_);
      uVar76 = auVar41._12_4_;
      local_2620._12_4_ = (float)(uVar76 ^ auVar53._12_4_);
      auVar41 = vfmadd231ps_fma(auVar35,auVar49,auVar33);
      local_2620._16_4_ = (float)(uVar12 ^ auVar41._0_4_);
      local_2620._20_4_ = (float)(uVar74 ^ auVar41._4_4_);
      local_2620._24_4_ = (float)(uVar75 ^ auVar41._8_4_);
      local_2620._28_4_ = (float)(uVar76 ^ auVar41._12_4_);
      auVar53 = ZEXT816(0) << 0x20;
      auVar41 = vcmpps_avx(local_2620._0_16_,auVar53,5);
      auVar49 = vcmpps_avx(local_2620._16_16_,auVar53,5);
      auVar41 = vandps_avx(auVar49,auVar41);
      auVar67._8_4_ = 0x7fffffff;
      auVar67._0_8_ = 0x7fffffff7fffffff;
      auVar67._12_4_ = 0x7fffffff;
      local_25f0 = vandps_avx(auVar58,auVar67);
      auVar49 = vcmpps_avx(auVar58,auVar53,4);
      auVar41 = vandps_avx(auVar49,auVar41);
      auVar35._0_4_ = local_2620._0_4_ + local_2620._16_4_;
      auVar35._4_4_ = local_2620._4_4_ + local_2620._20_4_;
      auVar35._8_4_ = local_2620._8_4_ + local_2620._24_4_;
      auVar35._12_4_ = local_2620._12_4_ + local_2620._28_4_;
      auVar49 = vcmpps_avx(auVar35,local_25f0,2);
      auVar53 = auVar49 & auVar41;
      if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar53[0xf] < '\0'
         ) {
        auVar41 = vandps_avx(auVar41,auVar49);
        auVar36._0_4_ = local_2570[0]._0_4_ * auVar32._0_4_;
        auVar36._4_4_ = local_2570[0]._4_4_ * auVar32._4_4_;
        auVar36._8_4_ = local_2570[0]._8_4_ * auVar32._8_4_;
        auVar36._12_4_ = local_2570[0]._12_4_ * auVar32._12_4_;
        auVar49 = vfmadd213ps_fma(auVar37,local_2580,auVar36);
        auVar49 = vfmadd213ps_fma(auVar31,local_2590,auVar49);
        local_2600._0_4_ = (float)(uVar12 ^ auVar49._0_4_);
        local_2600._4_4_ = (float)(uVar74 ^ auVar49._4_4_);
        local_2600._8_4_ = (float)(uVar75 ^ auVar49._8_4_);
        local_2600._12_4_ = (float)(uVar76 ^ auVar49._12_4_);
        fVar57 = *(float *)(ray + k * 4 + 0x30);
        auVar37._0_4_ = local_25f0._0_4_ * fVar57;
        auVar37._4_4_ = local_25f0._4_4_ * fVar57;
        auVar37._8_4_ = local_25f0._8_4_ * fVar57;
        auVar37._12_4_ = local_25f0._12_4_ * fVar57;
        auVar49 = vcmpps_avx(auVar37,local_2600,1);
        fVar57 = *(float *)(ray + k * 4 + 0x80);
        auVar52._0_4_ = local_25f0._0_4_ * fVar57;
        auVar52._4_4_ = local_25f0._4_4_ * fVar57;
        auVar52._8_4_ = local_25f0._8_4_ * fVar57;
        auVar52._12_4_ = local_25f0._12_4_ * fVar57;
        auVar53 = vcmpps_avx(local_2600,auVar52,2);
        auVar49 = vandps_avx(auVar49,auVar53);
        auVar53 = auVar41 & auVar49;
        if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar53[0xf] < '\0') {
          local_2700 = vandps_avx(auVar41,auVar49);
          local_25d0 = local_2700;
          auVar41 = vrcpps_avx(local_25f0);
          auVar45._8_4_ = 0x3f800000;
          auVar45._0_8_ = 0x3f8000003f800000;
          auVar45._12_4_ = 0x3f800000;
          auVar49 = vfnmadd213ps_fma(local_25f0,auVar41,auVar45);
          auVar41 = vfmadd132ps_fma(auVar49,auVar41,auVar41);
          fVar64 = auVar41._0_4_;
          local_25a0._0_4_ = fVar64 * local_2600._0_4_;
          fVar69 = auVar41._4_4_;
          local_25a0._4_4_ = fVar69 * local_2600._4_4_;
          fVar70 = auVar41._8_4_;
          local_25a0._8_4_ = fVar70 * local_2600._8_4_;
          fVar71 = auVar41._12_4_;
          local_25a0._12_4_ = fVar71 * local_2600._12_4_;
          auVar40 = ZEXT1664(local_25a0);
          local_25c0[0] = fVar64 * local_2620._0_4_;
          local_25c0[1] = fVar69 * local_2620._4_4_;
          local_25c0[2] = fVar70 * local_2620._8_4_;
          local_25c0[3] = fVar71 * local_2620._12_4_;
          auVar46._8_4_ = 0x7f800000;
          auVar46._0_8_ = 0x7f8000007f800000;
          auVar46._12_4_ = 0x7f800000;
          auVar41 = vblendvps_avx(auVar46,local_25a0,local_2700);
          local_25b0[0] = fVar64 * local_2620._16_4_;
          local_25b0[1] = fVar69 * local_2620._20_4_;
          local_25b0[2] = fVar70 * local_2620._24_4_;
          local_25b0[3] = fVar71 * local_2620._28_4_;
          auVar49 = vshufps_avx(auVar41,auVar41,0xb1);
          auVar49 = vminps_avx(auVar49,auVar41);
          auVar53 = vshufpd_avx(auVar49,auVar49,1);
          auVar49 = vminps_avx(auVar53,auVar49);
          auVar41 = vcmpps_avx(auVar41,auVar49,0);
          auVar53 = local_2700 & auVar41;
          auVar49 = vpcmpeqd_avx(auVar49,auVar49);
          if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar53[0xf] < '\0') {
            auVar49 = auVar41;
          }
          auVar41 = vandps_avx(local_2700,auVar49);
          local_26e8 = pSVar17;
          do {
            auVar41 = vpslld_avx(auVar41,0x1f);
            uVar9 = vmovmskps_avx(auVar41);
            uVar25 = 0;
            for (uVar23 = CONCAT44((int)(uVar23 >> 0x20),uVar9); (uVar23 & 1) == 0;
                uVar23 = uVar23 >> 1 | 0x8000000000000000) {
              uVar25 = uVar25 + 1;
            }
            local_24b0 = *(uint *)((long)&local_2520 + uVar25 * 4);
            uVar23 = (ulong)local_24b0;
            pGVar4 = (pSVar17->geometries).items[uVar23].ptr;
            if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_2700 + uVar25 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar23 = (ulong)(uint)((int)uVar25 << 2);
                uVar9 = *(undefined4 *)((long)local_25c0 + uVar23);
                uVar3 = *(undefined4 *)((long)local_25b0 + uVar23);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar23);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2590 + uVar23);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2580 + uVar23);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2570[0] + uVar23);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar9;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_2630 + uVar23);
                *(uint *)(ray + k * 4 + 0x120) = local_24b0;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              local_26b0 = auVar40._0_16_;
              uVar23 = (ulong)(uint)((int)uVar25 * 4);
              uVar9 = *(undefined4 *)((long)local_25c0 + uVar23);
              local_24e0._4_4_ = uVar9;
              local_24e0._0_4_ = uVar9;
              local_24e0._8_4_ = uVar9;
              local_24e0._12_4_ = uVar9;
              local_24d0 = *(undefined4 *)((long)local_25b0 + uVar23);
              local_24c0 = *(undefined4 *)((long)&local_2630 + uVar23);
              uVar9 = *(undefined4 *)(local_2590 + uVar23);
              local_2500 = *(undefined4 *)(local_2580 + uVar23);
              uVar3 = *(undefined4 *)(local_2570[0] + uVar23);
              local_24f0._4_4_ = uVar3;
              local_24f0._0_4_ = uVar3;
              local_24f0._8_4_ = uVar3;
              local_24f0._12_4_ = uVar3;
              local_2510[0] = (RTCHitN)(char)uVar9;
              local_2510[1] = (RTCHitN)(char)((uint)uVar9 >> 8);
              local_2510[2] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
              local_2510[3] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
              local_2510[4] = (RTCHitN)(char)uVar9;
              local_2510[5] = (RTCHitN)(char)((uint)uVar9 >> 8);
              local_2510[6] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
              local_2510[7] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
              local_2510[8] = (RTCHitN)(char)uVar9;
              local_2510[9] = (RTCHitN)(char)((uint)uVar9 >> 8);
              local_2510[10] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
              local_2510[0xb] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
              local_2510[0xc] = (RTCHitN)(char)uVar9;
              local_2510[0xd] = (RTCHitN)(char)((uint)uVar9 >> 8);
              local_2510[0xe] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
              local_2510[0xf] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
              uStack_24fc = local_2500;
              uStack_24f8 = local_2500;
              uStack_24f4 = local_2500;
              uStack_24cc = local_24d0;
              uStack_24c8 = local_24d0;
              uStack_24c4 = local_24d0;
              uStack_24bc = local_24c0;
              uStack_24b8 = local_24c0;
              uStack_24b4 = local_24c0;
              uStack_24ac = local_24b0;
              uStack_24a8 = local_24b0;
              uStack_24a4 = local_24b0;
              vpcmpeqd_avx2(ZEXT1632(local_24e0),ZEXT1632(local_24e0));
              uStack_249c = context->user->instID[0];
              local_24a0 = uStack_249c;
              uStack_2498 = uStack_249c;
              uStack_2494 = uStack_249c;
              uStack_2490 = context->user->instPrimID[0];
              uStack_248c = uStack_2490;
              uStack_2488 = uStack_2490;
              uStack_2484 = uStack_2490;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar23);
              local_26a0 = *local_2690;
              local_2660.valid = (int *)local_26a0;
              local_2660.geometryUserPtr = pGVar4->userPtr;
              local_2660.context = context->user;
              local_2660.hit = local_2510;
              local_2660.N = 4;
              local_2660.ray = (RTCRayN *)ray;
              if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->intersectionFilterN)(&local_2660);
              }
              if (local_26a0 == (undefined1  [16])0x0) {
                auVar41 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar41 = auVar41 ^ _DAT_01f46b70;
              }
              else {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var5)(&local_2660);
                }
                auVar49 = vpcmpeqd_avx(local_26a0,_DAT_01f45a50);
                auVar41 = auVar49 ^ _DAT_01f46b70;
                if (local_26a0 != (undefined1  [16])0x0) {
                  auVar49 = auVar49 ^ _DAT_01f46b70;
                  auVar53 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])local_2660.hit);
                  *(undefined1 (*) [16])(local_2660.ray + 0xc0) = auVar53;
                  auVar53 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(local_2660.hit + 0x10));
                  *(undefined1 (*) [16])(local_2660.ray + 0xd0) = auVar53;
                  auVar53 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(local_2660.hit + 0x20));
                  *(undefined1 (*) [16])(local_2660.ray + 0xe0) = auVar53;
                  auVar53 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(local_2660.hit + 0x30));
                  *(undefined1 (*) [16])(local_2660.ray + 0xf0) = auVar53;
                  auVar53 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(local_2660.hit + 0x40));
                  *(undefined1 (*) [16])(local_2660.ray + 0x100) = auVar53;
                  auVar53 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(local_2660.hit + 0x50));
                  *(undefined1 (*) [16])(local_2660.ray + 0x110) = auVar53;
                  auVar53 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(local_2660.hit + 0x60));
                  *(undefined1 (*) [16])(local_2660.ray + 0x120) = auVar53;
                  auVar53 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(local_2660.hit + 0x70));
                  *(undefined1 (*) [16])(local_2660.ray + 0x130) = auVar53;
                  auVar49 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(local_2660.hit + 0x80));
                  *(undefined1 (*) [16])(local_2660.ray + 0x140) = auVar49;
                }
              }
              auVar38._8_8_ = 0x100000001;
              auVar38._0_8_ = 0x100000001;
              if ((auVar38 & auVar41) == (undefined1  [16])0x0) {
                *(float *)(ray + k * 4 + 0x80) = fVar57;
              }
              else {
                fVar57 = *(float *)(ray + k * 4 + 0x80);
              }
              *(undefined4 *)(local_2700 + uVar25 * 4) = 0;
              auVar39._4_4_ = fVar57;
              auVar39._0_4_ = fVar57;
              auVar39._8_4_ = fVar57;
              auVar39._12_4_ = fVar57;
              auVar40 = ZEXT1664(local_26b0);
              auVar41 = vcmpps_avx(local_26b0,auVar39,2);
              local_2700 = vandps_avx(auVar41,local_2700);
              uVar23 = uVar25;
              pSVar17 = local_26e8;
            }
            if ((((local_2700 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_2700 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_2700 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_2700[0xf]) break;
            auVar47._8_4_ = 0x7f800000;
            auVar47._0_8_ = 0x7f8000007f800000;
            auVar47._12_4_ = 0x7f800000;
            auVar41 = vblendvps_avx(auVar47,auVar40._0_16_,local_2700);
            auVar49 = vshufps_avx(auVar41,auVar41,0xb1);
            auVar49 = vminps_avx(auVar49,auVar41);
            auVar53 = vshufpd_avx(auVar49,auVar49,1);
            auVar49 = vminps_avx(auVar53,auVar49);
            auVar49 = vcmpps_avx(auVar41,auVar49,0);
            auVar53 = local_2700 & auVar49;
            auVar41 = local_2700;
            if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar53[0xf] < '\0') {
              auVar41 = vandps_avx(auVar49,local_2700);
            }
            auVar41 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar41);
          } while( true );
        }
      }
      auVar63 = ZEXT3264(local_23c0);
      auVar68 = ZEXT3264(local_23e0);
      auVar73 = ZEXT3264(local_2400);
      auVar79 = ZEXT3264(local_2420);
      auVar81 = ZEXT3264(local_2440);
      auVar84 = ZEXT3264(local_2460);
      auVar86 = ZEXT3264(local_2480);
      uVar23 = local_2680;
      uVar25 = local_2688;
    }
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar40 = ZEXT3264(CONCAT428(uVar9,CONCAT424(uVar9,CONCAT420(uVar9,CONCAT416(uVar9,CONCAT412(
                                                  uVar9,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))))))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }